

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sudoku.cpp
# Opt level: O0

void __thiscall Sudoku::collectSolutionHints(Sudoku *this,string *filename)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  ulong uVar5;
  size_type sVar6;
  __shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var7;
  element_type *peVar8;
  reference plVar9;
  double dVar10;
  undefined1 auVar11 [16];
  longlong value;
  iterator __end1;
  iterator __begin1;
  vector<long_long,_std::allocator<long_long>_> *__range1;
  double average;
  string local_70 [4];
  int i;
  undefined1 local_49;
  int local_48;
  int iStack_44;
  bool createSolutionHints;
  int i_1;
  int n;
  int numberRuns;
  undefined1 local_30 [8];
  FieldVector testFields;
  string *filename_local;
  Sudoku *this_local;
  
  testFields.super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)filename;
  poVar4 = std::operator<<((ostream *)&std::cout,"collect solution hints");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>::vector
            ((vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_> *)local_30);
  createFieldCopy(this,(vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_> *)
                       local_30);
  i_1 = 1;
  for (iStack_44 = 0; iStack_44 < 1; iStack_44 = iStack_44 + 1) {
    local_48 = 0;
    while( true ) {
      uVar5 = (ulong)local_48;
      sVar6 = std::vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>::size
                        ((vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_> *
                         )local_30);
      if (sVar6 <= uVar5) break;
      p_Var7 = (__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               std::vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>::
               operator[]((vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                           *)local_30,(long)local_48);
      peVar8 = std::__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         (p_Var7);
      bVar2 = Field::fixed(peVar8);
      if (!bVar2) {
        p_Var7 = (__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 std::vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>::
                 operator[]((vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                             *)local_30,(long)local_48);
        peVar8 = std::__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(p_Var7);
        Field::resetTriedValues(peVar8);
      }
      local_48 = local_48 + 1;
    }
    bVar2 = iStack_44 == 0;
    local_49 = bVar2;
    std::__cxx11::string::string(local_70,(string *)filename);
    (*this->_vptr_Sudoku[2])(this,(ulong)bVar2,local_30,1,local_70);
    std::__cxx11::string::~string(local_70);
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"average number of possibilities from ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,1);
  poVar4 = std::operator<<(poVar4," runs: ");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  __range1 = (vector<long_long,_std::allocator<long_long>_> *)0x0;
  __end1 = std::vector<long_long,_std::allocator<long_long>_>::begin(&this->nPossibilities_);
  value = (longlong)std::vector<long_long,_std::allocator<long_long>_>::end(&this->nPossibilities_);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>
                                *)&value);
    if (!bVar2) break;
    plVar9 = __gnu_cxx::
             __normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>::
             operator*(&__end1);
    lVar1 = *plVar9;
    dVar10 = round((double)lVar1 / (double)this->nRuns_);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,dVar10);
    std::operator<<(poVar4," ");
    __range1 = (vector<long_long,_std::allocator<long_long>_> *)
               ((double)lVar1 / (double)this->nRuns_ + (double)__range1);
    __gnu_cxx::__normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>::
    operator++(&__end1);
  }
  sVar6 = std::vector<long_long,_std::allocator<long_long>_>::size(&this->nPossibilities_);
  auVar11._8_4_ = (int)(sVar6 >> 0x20);
  auVar11._0_8_ = sVar6;
  auVar11._12_4_ = 0x45300000;
  poVar4 = (ostream *)
           std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<(poVar4," total average: ");
  poVar4 = (ostream *)
           std::ostream::operator<<
                     (poVar4,(double)__range1 /
                             ((auVar11._8_8_ - 1.9342813113834067e+25) +
                             ((double)CONCAT44(0x43300000,(int)sVar6) - 4503599627370496.0)));
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<(poVar4," nfixed: ");
  iVar3 = nFixed(this);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>::~vector
            ((vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_> *)local_30);
  return;
}

Assistant:

void Sudoku::collectSolutionHints(std::string filename)
{
  //std::cout<<"Press Enter . . . "<<std::endl;
  //std::cin.get();
  std::cout<<"collect solution hints"<<std::endl;

  FieldVector testFields;   // testFields is created as copy of fields_ the first time fixSomeFieldsToGetASolvableSudoku is called

  createFieldCopy(testFields);

  const int numberRuns = 1;
  for(int n = 0; n < numberRuns; n++)
  {
    // clear tried values
    for(int i = 0; i < testFields.size(); i++)
    {
      if(!testFields[i]->fixed())
        testFields[i]->resetTriedValues();
    }

    bool createSolutionHints = (n == numberRuns-1);
    fixSomeFieldsToGetASolvableSudoku(createSolutionHints, testFields, true, filename);
  }

  int i=0;
  std::cout<<"average number of possibilities from "<<numberRuns<<" runs: "<<std::endl;
  double average = 0.0;
  for(long long value : nPossibilities_)
  {
    std::cout<<round((double)value/nRuns_)<<" ";
    average += (double)value/nRuns_;
    i++;
  }
  average /= nPossibilities_.size();

  std::cout<<std::endl<<" total average: "<<average<<std::endl
    <<" nfixed: "<<nFixed()<<std::endl;
}